

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinStrReplace
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  bool bVar1;
  const_reference pvVar2;
  undefined8 uVar3;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *pbVar4;
  size_type sVar5;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDX;
  allocator<char> *in_RSI;
  long in_RDI;
  Value VVar6;
  size_type index;
  size_type pos;
  UString new_str;
  HeapString *to;
  HeapString *from;
  HeapString *str;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000178;
  string *in_stack_00000180;
  LocationRange *in_stack_00000188;
  Interpreter *in_stack_00000190;
  UString *in_stack_fffffffffffffe88;
  Interpreter *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffea0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffea8;
  allocator_type *in_stack_fffffffffffffeb8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffec0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffec8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined4 uStack_104;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_f0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_e8;
  undefined1 local_c2;
  char local_c1 [33];
  anon_union_8_3_4e909c26_for_v local_a0;
  anon_union_8_3_4e909c26_for_v local_98;
  anon_union_8_3_4e909c26_for_v local_90;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  allocator<char> local_39;
  string local_38 [32];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_18;
  allocator<char> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
             (allocator<char> *)in_stack_fffffffffffffec0);
  local_84 = 0x13;
  local_80 = 0x13;
  local_7c = 0x13;
  local_78 = &local_84;
  local_70 = 3;
  pbVar4 = local_18;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22a4d2);
  __l._M_len = (size_type)pbVar4;
  __l._M_array = (iterator)in_stack_fffffffffffffec8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_fffffffffffffec0,__l,in_stack_fffffffffffffeb8);
  validateBuiltinArgs(in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)this);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)in_stack_fffffffffffffea0);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22a536);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,0);
  local_90 = pvVar2->v;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,1);
  local_98 = pvVar2->v;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,2);
  local_a0 = pvVar2->v;
  bVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::empty
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)0x22a5ba);
  if (!bVar1) {
    std::__cxx11::u32string::u32string(pbVar4,in_stack_fffffffffffffec8);
    local_f0 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x0;
    while ((pbVar4 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)std::__cxx11::
                        basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        ::size(&local_e8), local_f0 < pbVar4 &&
           (in_stack_fffffffffffffea0 =
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::find
                           (local_f0,in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0)
           , in_stack_fffffffffffffea0 !=
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             0xffffffffffffffff))) {
      in_stack_fffffffffffffea8 = in_stack_fffffffffffffea0;
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      size((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
           (local_98.h + 1));
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      replace(in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,(size_type)local_f0,
              in_stack_fffffffffffffea8);
      sVar5 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(local_a0.h + 1));
      local_f0 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 ((long)&(((_Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                            *)&in_stack_fffffffffffffea0->_M_dataplus)->_M_impl).
                         super__Vector_impl_data._M_start + sVar5);
    }
    VVar6 = makeString(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_104,VVar6.t);
    ((anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48))->h = (HeapEntity *)VVar6.v;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               VVar6.v.h);
    return (AST *)0x0;
  }
  local_c2 = 1;
  uVar3 = __cxa_allocate_exception(0x38);
  __s = local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar4,__s,
             local_10);
  makeError((Interpreter *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
            (LocationRange *)in_stack_fffffffffffffe90,(string *)in_stack_fffffffffffffe88);
  local_c2 = 0;
  __cxa_throw(uVar3,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinStrReplace(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "strReplace", args, {Value::STRING, Value::STRING, Value::STRING});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        const auto *from = static_cast<const HeapString *>(args[1].v.h);
        const auto *to = static_cast<const HeapString *>(args[2].v.h);
        if (from->value.empty()) {
          throw makeError(loc, "'from' string must not be zero length.");
        }
        UString new_str(str->value);
        UString::size_type pos = 0;
        while (pos < new_str.size()) {
            auto index = new_str.find(from->value, pos);
            if (index == new_str.npos) {
                break;
            }
            new_str.replace(index, from->value.size(), to->value);
            pos = index + to->value.size();
        }
        scratch = makeString(new_str);
        return nullptr;
    }